

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFindPackageCommand::HandlePackageMode
          (cmFindPackageCommand *this,HandlePackageModeType handlePackageModeType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  first;
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  last;
  pointer pbVar4;
  pointer pCVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char *pcVar10;
  string *__lhs;
  ostream *poVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  char *unaff_R13;
  ConfigFileInfo *i;
  pointer pCVar15;
  ConfigFileInfo *info;
  ConfigFileInfo *pCVar16;
  string consideredVersionsVar;
  string consideredVersions;
  string consideredConfigFiles;
  string foundVar;
  string notFoundMessage;
  string notFoundMessageVar;
  string fileVar;
  string consideredConfigsVar;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  uint local_3ac;
  ConfigFileInfo *local_3a8;
  char *local_3a0;
  long local_398;
  char local_390;
  undefined7 uStack_38f;
  string local_380;
  string local_360;
  string local_340;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::_M_erase_at_end(&this->ConsideredConfigs,
                    (this->ConsideredConfigs).
                    super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pcVar10 = cmMakefile::GetDefinition
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
  if (this->UseConfigFiles == true) {
    bVar7 = cmSystemTools::IsOff(pcVar10);
    if (bVar7) {
      bVar7 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_320,pcVar10,(allocator<char> *)local_1a8);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_320);
      bVar7 = cmsys::SystemTools::FileIsFullPath((string *)local_320);
      if (!bVar7) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320);
        std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
        __lhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                          ((this->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320);
        std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
      }
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = local_1a8 + 0x10;
      bVar7 = FindConfigFile(this,(string *)local_320,(string *)local_1a8);
      if (bVar7) {
        std::__cxx11::string::_M_assign((string *)&this->FileFound);
      }
      pcVar10 = cmMakefile::GetDefinition
                          ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
    }
    bVar8 = cmSystemTools::IsOff(pcVar10);
    if ((bVar8) || (bVar7 == false)) {
      bVar7 = FindConfig(this);
    }
    unaff_R13 = pcVar10;
    if ((bVar7 != false) && ((this->FileFound)._M_string_length == 0)) {
      pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      local_320._0_8_ = local_320 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_320,"fileFound is true but FileFound is empty!","");
      cmMakefile::IssueMessage(pcVar2,INTERNAL_ERROR,(string *)local_320);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      bVar7 = false;
    }
  }
  else {
    bVar7 = false;
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_3d0);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_380);
  local_3a0 = &local_390;
  local_398 = 0;
  local_390 = '\0';
  if (bVar7 == false) {
    uVar14 = (uint)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    bVar7 = false;
    bVar8 = false;
  }
  else {
    bVar7 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_3d0);
    if ((bVar7) &&
       (bVar7 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_3d0),
       !bVar7)) {
      cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_3d0);
    }
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_380);
    StoreVersionFound(this);
    bVar9 = ReadListFile(this,&this->FileFound,DoPolicyScope);
    bVar7 = false;
    bVar8 = false;
    uVar14 = 0;
    if (bVar9) {
      bVar7 = cmMakefile::IsDefinitionSet
                        ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_3d0);
      if ((!bVar7) ||
         (bVar7 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_3d0),
         bVar7)) {
        bVar8 = true;
        bVar7 = false;
      }
      else {
        cmMakefile::GetSafeDefinition
                  ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_380);
        std::__cxx11::string::_M_assign((string *)&local_3a0);
        bVar7 = true;
        bVar8 = false;
      }
      uVar14 = 1;
    }
  }
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"CMAKE_FIND_PACKAGE_PREFER_CONFIG","");
  bVar9 = cmMakefile::IsOn(pcVar2,(string *)local_320);
  if (bVar9 && !bVar8) {
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    uVar14 = uVar14 & 0xff;
    if (handlePackageModeType == Config) {
      uVar14 = 0;
    }
  }
  else if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_3ac = uVar14;
  if ((char)uVar14 != '\x01' || bVar8) goto LAB_002584e3;
  if (this->Required == false) {
    if (this->Quiet != false) goto LAB_002584e3;
    if (((this->UseConfigFiles != true) || (this->UseFindModules != false)) ||
       ((this->ConsideredConfigs).
        super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->ConsideredConfigs).
        super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00257b24;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Could NOT find ",0xf);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                         (this->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (missing: ",0xb);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_DIR)",5);
    pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::DisplayStatus(pcVar2,(string *)local_1a8,-1.0);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
  }
  else {
LAB_00257b24:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"Found package configuration file:\n  ",0x24);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(this->FileFound)._M_dataplus._M_p,
                           (this->FileFound)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nbut it set ",0xc);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," to FALSE so package \"",0x16);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"\" is considered to be NOT FOUND.",0x20);
      if (local_398 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320," Reason given by package: \n",0x1b);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,local_3a0,local_398);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      }
    }
    else {
      first._M_current =
           (this->ConsideredConfigs).
           super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      last._M_current =
           (this->ConsideredConfigs).
           super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (first._M_current == last._M_current) {
        paVar1 = &local_430.field_2;
        local_430._M_string_length = 0;
        local_430.field_2._M_local_buf[0] = '\0';
        local_430._M_dataplus._M_p = (pointer)paVar1;
        if ((this->Version)._M_string_length != 0) {
          std::__cxx11::string::_M_replace((ulong)&local_430,0,(char *)0x0,0x5588cc);
          std::__cxx11::string::_M_append
                    ((char *)&local_430,(ulong)(this->Version)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_430);
        }
        if (this->UseConfigFiles == true) {
          if (this->UseFindModules == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"By not providing \"Find",0x16);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                                 (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,
                       ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                       ,0x6c);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"\", but CMake did not find one.\n",0x1f);
          }
          if ((long)(this->Configs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->Configs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x20) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"Could not find a package configuration file named \"",
                       0x33);
            pbVar4 = (this->Configs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(pbVar4->_M_dataplus)._M_p,
                                 pbVar4->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"\" provided by package \"",0x17);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_430._M_dataplus._M_p,local_430._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,
                       "Could not find a package configuration file provided by \"",0x39);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                                 (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_430._M_dataplus._M_p,local_430._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11," with any of the following names:\n",0x22);
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"  ","");
            local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"");
            local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"\n","");
            cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_3f0,&local_410,&this->Configs,&local_340,&local_360);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_3f0._M_dataplus._M_p,local_3f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
              operator_delete(local_3f0._M_dataplus._M_p,
                              CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                                       local_3f0.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,
                              CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                                       local_410.field_2._M_local_buf[0]) + 1);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"Add the installation prefix of \"",0x20);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" to CMAKE_PREFIX_PATH or set \"",0x1f);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(this->Variable)._M_dataplus._M_p,
                               (this->Variable)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" to a directory containing one of the above files. If \"",0x38);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
          lVar12 = 0x50;
          pcVar10 = 
          "\" provides a separate development package or SDK, be sure it has been installed.";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"No \"Find",8);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,".cmake\" found in ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"CMAKE_MODULE_PATH.",0x12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Find",4);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,
                     ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                     ,0x186);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
          lVar12 = 0xc9;
          pcVar10 = 
          ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
          ;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,lVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != paVar1) {
          operator_delete(local_430._M_dataplus._M_p,
                          CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                                   local_430.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        local_3a8 = (ConfigFileInfo *)
                    cmRemoveDuplicates<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>
                              (first,last);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,"Could not find a configuration file for package \"",0x31);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                             (this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" that ",7);
        pcVar10 = "is compatible with";
        if ((ulong)this->VersionExact != 0) {
          pcVar10 = "exactly matches";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,pcVar10,((ulong)this->VersionExact ^ 1) * 3 + 0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," requested version \"",0x14);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(this->Version)._M_dataplus._M_p,
                             (this->Version)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"The following configuration files were considered but not accepted:\n",
                   0x44);
        pCVar16 = (this->ConsideredConfigs).
                  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pCVar16 != local_3a8) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"  ",2);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(pCVar16->filename)._M_dataplus._M_p,
                                 (pCVar16->filename)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,", version: ",0xb);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pCVar16->version)._M_dataplus._M_p,
                                 (pCVar16->version)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            pCVar16 = pCVar16 + 1;
          } while (pCVar16 != local_3a8);
        }
      }
    }
    pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    bVar7 = this->Required;
    std::__cxx11::stringbuf::str();
    bVar13 = bVar7 ^ 1;
    cmMakefile::IssueMessage(pcVar2,(uint)bVar13 + (uint)bVar13 * 2 + FATAL_ERROR,&local_430);
    paVar1 = &local_430.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar1) {
      operator_delete(local_430._M_dataplus._M_p,
                      CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                               local_430.field_2._M_local_buf[0]) + 1);
    }
    if (this->Required == true) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    std::__cxx11::stringbuf::str();
    sVar6 = local_430._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar1) {
      operator_delete(local_430._M_dataplus._M_p,
                      CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                               local_430.field_2._M_local_buf[0]) + 1);
    }
    if (sVar6 != 0) {
      pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_430);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != paVar1) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                                 local_430.field_2._M_local_buf[0]) + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
LAB_002584e3:
  pcVar10 = "0";
  if (bVar8) {
    pcVar10 = "1";
  }
  cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_3d0,pcVar10);
  local_320._0_8_ = local_320 + 0x10;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_320,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append(local_320);
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  if (bVar8) {
    cmMakefile::AddDefinition(pcVar2,(string *)local_320,(this->FileFound)._M_dataplus._M_p);
  }
  else {
    cmMakefile::RemoveDefinition(pcVar2,(string *)local_320);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append(local_1a8);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  pcVar3 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,pcVar3,pcVar3 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_430);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0._M_string_length = 0;
  local_3f0.field_2._M_local_buf[0] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410._M_string_length = 0;
  local_410.field_2._M_local_buf[0] = '\0';
  pCVar15 = (this->ConsideredConfigs).
            super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar5 = (this->ConsideredConfigs).
           super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar15 != pCVar5) {
    do {
      std::__cxx11::string::append((char *)&local_3f0);
      std::__cxx11::string::append((char *)&local_410);
      std::__cxx11::string::_M_append
                ((char *)&local_3f0,(ulong)(pCVar15->filename)._M_dataplus._M_p);
      std::__cxx11::string::_M_append((char *)&local_410,(ulong)(pCVar15->version)._M_dataplus._M_p)
      ;
      pCVar15 = pCVar15 + 1;
    } while (pCVar15 != pCVar5);
  }
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_1a8,
             local_3f0._M_dataplus._M_p);
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_430,
             local_410._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,
                    CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                             local_410.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,
                    CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                             local_430.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  return SUB41(local_3ac,0);
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode(
  HandlePackageModeType handlePackageModeType)
{
  this->ConsideredConfigs.clear();

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles) {
    if (!cmSystemTools::IsOff(def)) {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if (!cmSystemTools::FileIsFullPath(dir)) {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
      }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file)) {
        this->FileFound = file;
        fileFound = true;
      }
      def = this->Makefile->GetDefinition(this->Variable);
    }

    // Search for the config file if it is not already found.
    if (cmSystemTools::IsOff(def) || !fileFound) {
      fileFound = this->FindConfig();
    }

    // Sanity check.
    if (fileFound && this->FileFound.empty()) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "fileFound is true but FileFound is empty!");
      fileFound = false;
    }
  }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if (fileFound) {
    if (this->Makefile->IsDefinitionSet(foundVar) &&
        !this->Makefile->IsOn(foundVar)) {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
    }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if (this->ReadListFile(this->FileFound, DoPolicyScope)) {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage =
          this->Makefile->GetSafeDefinition(notFoundMessageVar);
      }
    } else {
      // The configuration file is invalid.
      result = false;
    }
  }

  if (this->Makefile->IsOn("CMAKE_FIND_PACKAGE_PREFER_CONFIG") && !found &&
      handlePackageModeType == HandlePackageModeType::Config) {
    // Config mode failed. Allow Module case.
    result = false;
  }

  // package not found
  if (result && !found) {
    // warn if package required or neither quiet nor in config mode
    if (this->Required ||
        !(this->Quiet ||
          (this->UseConfigFiles && !this->UseFindModules &&
           this->ConsideredConfigs.empty()))) {
      // The variable is not set.
      std::ostringstream e;
      std::ostringstream aw;
      if (configFileSetFOUNDFalse) {
        /* clang-format off */
        e << "Found package configuration file:\n"
          "  " << this->FileFound << "\n"
          "but it set " << foundVar << " to FALSE so package \"" <<
          this->Name << "\" is considered to be NOT FOUND.";
        /* clang-format on */
        if (!notFoundMessage.empty()) {
          e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
      // If there are files in ConsideredConfigs, it means that FooConfig.cmake
      // have been found, but they didn't have appropriate versions.
      else if (!this->ConsideredConfigs.empty()) {
        std::vector<ConfigFileInfo>::const_iterator duplicate_end =
          cmRemoveDuplicates(this->ConsideredConfigs);
        e << "Could not find a configuration file for package \"" << this->Name
          << "\" that "
          << (this->VersionExact ? "exactly matches" : "is compatible with")
          << " requested version \"" << this->Version << "\".\n"
          << "The following configuration files were considered but not "
             "accepted:\n";

        for (ConfigFileInfo const& info :
             cmMakeRange(this->ConsideredConfigs.cbegin(), duplicate_end)) {
          e << "  " << info.filename << ", version: " << info.version << "\n";
        }
      } else {
        std::string requestedVersionString;
        if (!this->Version.empty()) {
          requestedVersionString = " (requested version ";
          requestedVersionString += this->Version;
          requestedVersionString += ")";
        }

        if (this->UseConfigFiles) {
          if (this->UseFindModules) {
            e << "By not providing \"Find" << this->Name
              << ".cmake\" in "
                 "CMAKE_MODULE_PATH this project has asked CMake to find a "
                 "package configuration file provided by \""
              << this->Name
              << "\", "
                 "but CMake did not find one.\n";
          }

          if (this->Configs.size() == 1) {
            e << "Could not find a package configuration file named \""
              << this->Configs[0] << "\" provided by package \"" << this->Name
              << "\"" << requestedVersionString << ".\n";
          } else {
            e << "Could not find a package configuration file provided by \""
              << this->Name << "\"" << requestedVersionString
              << " with any of the following names:\n"
              << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

          e << "Add the installation prefix of \"" << this->Name
            << "\" to "
               "CMAKE_PREFIX_PATH or set \""
            << this->Variable
            << "\" to a "
               "directory containing one of the above files. "
               "If \""
            << this->Name
            << "\" provides a separate development "
               "package or SDK, be sure it has been installed.";
        } else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
          e << "No \"Find" << this->Name << ".cmake\" found in "
            << "CMAKE_MODULE_PATH.";

          aw
            << "Find" << this->Name
            << ".cmake must either be part of this "
               "project itself, in this case adjust CMAKE_MODULE_PATH so that "
               "it points to the correct location inside its source tree.\n"
               "Or it must be installed by a package which has already been "
               "found via find_package().  In this case make sure that "
               "package has indeed been found and adjust CMAKE_MODULE_PATH to "
               "contain the location where that package has installed "
               "Find"
            << this->Name
            << ".cmake.  This must be a location "
               "provided by that package.  This error in general means that "
               "the buildsystem of this project is relying on a Find-module "
               "without ensuring that it is actually available.\n";
        }
      }

      this->Makefile->IssueMessage(this->Required ? MessageType::FATAL_ERROR
                                                  : MessageType::WARNING,
                                   e.str());
      if (this->Required) {
        cmSystemTools::SetFatalErrorOccured();
      }

      if (!aw.str().empty()) {
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, aw.str());
      }
    }
    // output result if in config mode but not in quiet mode
    else if (!this->Quiet) {
      std::ostringstream aw;
      aw << "Could NOT find " << this->Name << " (missing: " << this->Name
         << "_DIR)";
      this->Makefile->DisplayStatus(aw.str(), -1);
    }
  }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found ? "1" : "0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if (found) {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
  } else {
    this->Makefile->RemoveDefinition(fileVar);
  }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for (ConfigFileInfo const& i : this->ConsideredConfigs) {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += i.filename;
    consideredVersions += i.version;
    sep = ";";
  }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}